

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O1

void ftruncate_cb(uv_fs_t *req)

{
  int iVar1;
  
  if (req == &ftruncate_req) {
    if (ftruncate_req.fs_type != UV_FS_FTRUNCATE) goto LAB_00160f41;
    if (ftruncate_req.result == 0) {
      ftruncate_cb_count = ftruncate_cb_count + 1;
      uv_fs_req_cleanup(&ftruncate_req);
      req = (uv_fs_t *)loop;
      iVar1 = uv_fs_close(loop,&close_req,(uv_file)open_req1.result,close_cb);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_00160f4b;
    }
  }
  else {
    ftruncate_cb_cold_1();
LAB_00160f41:
    ftruncate_cb_cold_2();
  }
  ftruncate_cb_cold_3();
LAB_00160f4b:
  ftruncate_cb_cold_4();
  if (((ulong)((uv_loop_t *)req)->watcher_queue[0] & 3) == 0) {
    uv__signal_stop((uv_signal_t *)req);
    return;
  }
  __assert_fail("!uv__is_closing(handle)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/signal.c"
                ,0x202,"int uv_signal_stop(uv_signal_t *)");
}

Assistant:

static void ftruncate_cb(uv_fs_t* req) {
  int r;
  ASSERT(req == &ftruncate_req);
  ASSERT(req->fs_type == UV_FS_FTRUNCATE);
  ASSERT(req->result == 0);
  ftruncate_cb_count++;
  uv_fs_req_cleanup(req);
  r = uv_fs_close(loop, &close_req, open_req1.result, close_cb);
  ASSERT(r == 0);
}